

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# row_common.cc
# Opt level: O2

void NV12ToRGB24Row_AVX2(uint8_t *src_y,uint8_t *src_uv,uint8_t *dst_rgb24,
                        YuvConstants *yuvconstants,int width)

{
  uint uVar1;
  ulong uVar2;
  int width_00;
  ulong uVar3;
  uint8_t row [8192];
  uint8_t local_2060 [8240];
  
  uVar2 = (ulong)(uint)width;
  while (uVar1 = (uint)uVar2, 0 < (int)uVar1) {
    uVar3 = 0x800;
    if (uVar1 < 0x800) {
      uVar3 = uVar2;
    }
    width_00 = (int)uVar3;
    NV12ToARGBRow_AVX2(src_y,src_uv,local_2060,yuvconstants,width_00);
    ARGBToRGB24Row_AVX2(local_2060,dst_rgb24,width_00);
    src_y = src_y + uVar3;
    src_uv = src_uv + uVar3;
    dst_rgb24 = dst_rgb24 + (uint)(width_00 * 3);
    uVar2 = (ulong)(uVar1 - width_00);
  }
  return;
}

Assistant:

void NV12ToRGB24Row_AVX2(const uint8_t* src_y,
                         const uint8_t* src_uv,
                         uint8_t* dst_rgb24,
                         const struct YuvConstants* yuvconstants,
                         int width) {
  // Row buffer for intermediate ARGB pixels.
  SIMD_ALIGNED(uint8_t row[MAXTWIDTH * 4]);
  while (width > 0) {
    int twidth = width > MAXTWIDTH ? MAXTWIDTH : width;
    NV12ToARGBRow_AVX2(src_y, src_uv, row, yuvconstants, twidth);
#if defined(HAS_ARGBTORGB24ROW_AVX2)
    ARGBToRGB24Row_AVX2(row, dst_rgb24, twidth);
#else
    ARGBToRGB24Row_SSSE3(row, dst_rgb24, twidth);
#endif
    src_y += twidth;
    src_uv += twidth;
    dst_rgb24 += twidth * 3;
    width -= twidth;
  }
}